

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::DebugDatabase::compute_generators(DebugDatabase *this,Generator *top)

{
  pointer *this_00;
  bool bVar1;
  reference ppGVar2;
  Generator *local_a0;
  Generator *gen;
  iterator __end1;
  iterator __begin1;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *__range1;
  undefined1 local_70 [8];
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> generators;
  GeneratorGraph g;
  Generator *top_local;
  DebugDatabase *this_local;
  
  *(Generator **)(this + 0xe8) = top;
  this_00 = &generators.
             super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  GeneratorGraph::GeneratorGraph((GeneratorGraph *)this_00,top);
  GeneratorGraph::get_sorted_nodes
            ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)local_70,
             (GeneratorGraph *)this_00);
  __end1 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::begin
                     ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)local_70)
  ;
  gen = (Generator *)
        std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::end
                  ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)local_70);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                                *)&gen);
    if (!bVar1) break;
    ppGVar2 = __gnu_cxx::
              __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
              ::operator*(&__end1);
    local_a0 = *ppGVar2;
    std::
    unordered_set<kratos::Generator*,std::hash<kratos::Generator*>,std::equal_to<kratos::Generator*>,std::allocator<kratos::Generator*>>
    ::emplace<kratos::Generator*&>
              ((unordered_set<kratos::Generator*,std::hash<kratos::Generator*>,std::equal_to<kratos::Generator*>,std::allocator<kratos::Generator*>>
                *)(this + 0xb0),&local_a0);
    __gnu_cxx::
    __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~vector
            ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)local_70);
  GeneratorGraph::~GeneratorGraph
            ((GeneratorGraph *)
             &generators.
              super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void DebugDatabase::compute_generators(Generator *top) {
    top_ = top;
    GeneratorGraph g(top);
    auto generators = g.get_sorted_nodes();
    for (auto *gen : generators) {
        generators_.emplace(gen);
    }
}